

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmCommonTargetGenerator::AppendOSXVerFlag
          (cmCommonTargetGenerator *this,string *flags,string *lang,char *name,bool so)

{
  cmLocalCommonGenerator *pcVar1;
  ostream *poVar2;
  string local_218 [32];
  undefined1 local_1f8 [8];
  ostringstream vflag;
  int local_80;
  int local_7c;
  int patch;
  int minor;
  int major;
  char *flag;
  allocator local_51;
  undefined1 local_50 [8];
  string fvar;
  bool so_local;
  char *name_local;
  string *lang_local;
  string *flags_local;
  cmCommonTargetGenerator *this_local;
  
  fvar.field_2._M_local_buf[0xf] = so;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_50,"CMAKE_",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::__cxx11::string::operator+=((string *)local_50,(string *)lang);
  std::__cxx11::string::operator+=((string *)local_50,"_OSX_");
  std::__cxx11::string::operator+=((string *)local_50,name);
  std::__cxx11::string::operator+=((string *)local_50,"_VERSION_FLAG");
  _major = cmMakefile::GetDefinition(this->Makefile,(string *)local_50);
  if (_major == (char *)0x0) {
    minor = 1;
  }
  else {
    cmGeneratorTarget::GetTargetVersion
              (this->GeneratorTarget,(bool)(fvar.field_2._M_local_buf[0xf] & 1),&patch,&local_7c,
               &local_80);
    if (((0 < patch) || (0 < local_7c)) || (0 < local_80)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      poVar2 = std::operator<<((ostream *)local_1f8,_major);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,patch);
      poVar2 = std::operator<<(poVar2,".");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_7c);
      poVar2 = std::operator<<(poVar2,".");
      std::ostream::operator<<(poVar2,local_80);
      pcVar1 = this->LocalCommonGenerator;
      std::__cxx11::ostringstream::str();
      (*(pcVar1->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar1,flags,local_218);
      std::__cxx11::string::~string(local_218);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
    }
    minor = 0;
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmCommonTargetGenerator::AppendOSXVerFlag(std::string& flags,
                                               const std::string& lang,
                                               const char* name, bool so)
{
  // Lookup the flag to specify the version.
  std::string fvar = "CMAKE_";
  fvar += lang;
  fvar += "_OSX_";
  fvar += name;
  fvar += "_VERSION_FLAG";
  const char* flag = this->Makefile->GetDefinition(fvar);

  // Skip if no such flag.
  if (!flag) {
    return;
  }

  // Lookup the target version information.
  int major;
  int minor;
  int patch;
  this->GeneratorTarget->GetTargetVersion(so, major, minor, patch);
  if (major > 0 || minor > 0 || patch > 0) {
    // Append the flag since a non-zero version is specified.
    std::ostringstream vflag;
    vflag << flag << major << "." << minor << "." << patch;
    this->LocalCommonGenerator->AppendFlags(flags, vflag.str());
  }
}